

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourcesGL.hpp
# Opt level: O2

StorageBlockInfo * __thiscall
Diligent::ShaderResourcesGL::GetStorageBlock(ShaderResourcesGL *this,Uint32 Index)

{
  char (*in_R8) [18];
  string msg;
  Uint32 local_34;
  string local_30;
  
  if (this->m_NumStorageBlocks <= Index) {
    local_34 = Index;
    FormatString<char[22],unsigned_int,char[18]>
              (&local_30,(Diligent *)"Storage block index (",(char (*) [22])&local_34,
               (uint *)") is out of range",in_R8);
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"GetStorageBlock",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/ShaderResourcesGL.hpp"
               ,299);
    std::__cxx11::string::~string((string *)&local_30);
    Index = local_34;
  }
  return this->m_StorageBlocks + Index;
}

Assistant:

StorageBlockInfo& GetStorageBlock(Uint32 Index)
    {
        VERIFY(Index < m_NumStorageBlocks, "Storage block index (", Index, ") is out of range");
        return m_StorageBlocks[Index];
    }